

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forwarder.cpp
# Opt level: O2

void __thiscall
cppcms::forwarder::add_forwarding_rule
          (forwarder *this,shared_ptr<cppcms::mount_point> *p,string *ip,int port)

{
  mapped_type *this_00;
  unique_lock<booster::shared_mutex> lock;
  unique_lock<booster::shared_mutex> uStack_58;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_48;
  
  std::unique_lock<booster::shared_mutex>::unique_lock(&uStack_58,&this->mutex_);
  std::__cxx11::string::string((string *)&local_48,(string *)ip);
  local_48.second = port;
  this_00 = std::
            map<std::shared_ptr<cppcms::mount_point>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::less<std::shared_ptr<cppcms::mount_point>_>,_std::allocator<std::pair<const_std::shared_ptr<cppcms::mount_point>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
            ::operator[](&this->rules_,p);
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  operator=(this_00,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::unique_lock<booster::shared_mutex>::~unique_lock(&uStack_58);
  return;
}

Assistant:

void forwarder::add_forwarding_rule(booster::shared_ptr<mount_point> p,std::string const &ip,int port)
	{
		booster::unique_lock<booster::shared_mutex> lock(mutex_);
		rules_[p]=address_type(ip,port);
	}